

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O2

type __thiscall
cm::String::replace<char_const(&)[3]>
          (String *this,const_iterator first,const_iterator last,char (*s) [3])

{
  type pSVar1;
  string out;
  
  out._M_dataplus._M_p = (pointer)&out.field_2;
  out._M_string_length = 0;
  out.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&out);
  std::__cxx11::string::append<char_const*,void>((string *)&out,(this->view_)._M_str,first);
  std::__cxx11::string::append((char *)&out,(ulong)s);
  std::__cxx11::string::append<char_const*,void>
            ((string *)&out,last,(this->view_)._M_str + (this->view_)._M_len);
  pSVar1 = operator=(this,&out);
  std::__cxx11::string::~string((string *)&out);
  return pSVar1;
}

Assistant:

typename std::enable_if<AsStringView<T>::value, String&>::type replace(
    const_iterator first, const_iterator last, T&& s)
  {
    string_view v = AsStringView<T>::view(std::forward<T>(s));
    std::string out;
    out.reserve((first - this->view_.begin()) + v.size() +
                (this->view_.end() - last));
    out.append(this->view_.begin(), first);
    out.append(v.data(), v.size());
    out.append(last, this->view_.end());
    return *this = std::move(out);
  }